

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall MutableBuffer::check_size(MutableBuffer *this,size_t _size)

{
  unsigned_long *puVar1;
  void *pvVar2;
  bad_alloc *this_00;
  void *new_data;
  size_t local_20;
  size_t _reserved;
  size_t _size_local;
  MutableBuffer *this_local;
  
  if (this->reserved < _size) {
    new_data = (void *)((this->super_Buffer).size + this->growth);
    _reserved = _size;
    _size_local = (size_t)this;
    puVar1 = std::max<unsigned_long>((unsigned_long *)&new_data,&_reserved);
    local_20 = *puVar1;
    if ((this->super_Buffer).data == (void *)0x0) {
      pvVar2 = malloc(local_20);
      (this->super_Buffer).data = pvVar2;
      (this->super_Buffer).size = 0;
      (this->super_Buffer).owned = true;
    }
    else {
      pvVar2 = realloc((this->super_Buffer).data,local_20);
      if (pvVar2 == (void *)0x0) {
        this_00 = (bad_alloc *)__cxa_allocate_exception(8);
        std::bad_alloc::bad_alloc(this_00);
        __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (this->super_Buffer).data = pvVar2;
    }
    this->reserved = local_20;
  }
  return;
}

Assistant:

void
MutableBuffer::check_size(size_t _size) {
  if (reserved >= _size) {
    return;
  }

  size_t _reserved = std::max(size + growth, _size);

  if (data == nullptr) {
    data = ::malloc(_reserved);
    size = 0;
    owned = true;
  } else {
    void *new_data = ::realloc(data, _reserved);
    if (new_data == nullptr) {
      throw std::bad_alloc();
    }
    data = new_data;
  }

  reserved = _reserved;
}